

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void __thiscall absl::Mutex::LockSlowLoop(Mutex *this,SynchWaitParams *waitp,int flags)

{
  long *plVar1;
  MuHow pMVar2;
  Condition *pCVar3;
  bool bVar4;
  PerThreadSynch *pPVar5;
  ulong uVar6;
  ulong uVar7;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int iVar8;
  int extraout_EDX_05;
  int extraout_EDX_06;
  synchronization_internal *this_00;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  uint local_38;
  
  if (((this->mu_).super___atomic_base<long>._M_i & 0x10U) != 0) {
    PostSynchEvent(this,(uint)(waitp->how != (MuHow)kExclusiveS) * 2 + 4);
  }
  if ((waitp->thread->waitp != (SynchWaitParams *)0x0) &&
     (waitp->thread->suppress_fatal_errors == false)) {
    LockSlowLoop();
  }
  local_38 = 0;
  do {
    uVar9 = (this->mu_).super___atomic_base<long>._M_i;
    CheckForMutexCorruption(uVar9,"Lock");
    pMVar2 = waitp->how;
    iVar8 = extraout_EDX;
    if ((pMVar2->slow_need_zero & uVar9) == 0) {
      LOCK();
      uVar6 = (this->mu_).super___atomic_base<long>._M_i;
      bVar11 = uVar9 == uVar6;
      if (bVar11) {
        (this->mu_).super___atomic_base<long>._M_i =
             ((-(ulong)((flags & 1U) == 0) | 0xfffffffffffffffd) & uVar9 | pMVar2->fast_or) +
             pMVar2->fast_add;
        uVar6 = uVar9;
      }
      UNLOCK();
      if (bVar11) {
        pCVar3 = waitp->cond;
        if (((pCVar3 == (Condition *)0x0) || (pCVar3->eval_ == (_func_bool_Condition_ptr *)0x0)) ||
           (bVar11 = (*pCVar3->eval_)(pCVar3), bVar11)) {
LAB_00144ce1:
          if ((waitp->thread->waitp != (SynchWaitParams *)0x0) &&
             (waitp->thread->suppress_fatal_errors == false)) {
            LockSlowLoop();
          }
          if ((uVar6 & 0x10) != 0) {
            PostSynchEvent(this,(uint)(waitp->how != (MuHow)kExclusiveS) * 2 + 5);
            return;
          }
          return;
        }
        UnlockSlow(this,waitp);
        Block(this,waitp->thread);
        flags = flags | 1;
        this_00 = (synchronization_internal *)0x0;
        iVar8 = extraout_EDX_01;
      }
      else {
        this_00 = (synchronization_internal *)(ulong)local_38;
      }
    }
    else {
      if ((uVar9 & 0x44) == 0) {
        pPVar5 = Enqueue((PerThreadSynch *)0x0,waitp,uVar9,flags);
        if (pPVar5 == (PerThreadSynch *)0x0) {
          LockSlowLoop();
        }
        uVar7 = (ulong)((uint)uVar9 & (uint)((flags & 1U) == 0) * 2 + 0xb9);
        uVar6 = uVar7 + 4;
        uVar7 = uVar7 | 0x24;
        if ((uVar9 & 1) == 0) {
          uVar7 = uVar6;
        }
        iVar8 = 0x167e30;
        if (waitp->how != (MuHow)kExclusiveS) {
          uVar7 = uVar6;
        }
        LOCK();
        uVar6 = (this->mu_).super___atomic_base<long>._M_i;
        bVar11 = uVar9 == uVar6;
        if (bVar11) {
          (this->mu_).super___atomic_base<long>._M_i = uVar7 | (ulong)pPVar5;
          uVar6 = uVar9;
        }
        UNLOCK();
        if (!bVar11) {
          waitp->thread->waitp = (SynchWaitParams *)0x0;
        }
LAB_00144c77:
        iVar10 = 0;
        if (!bVar11) goto LAB_00144c95;
        Block(this,waitp->thread);
        flags = flags | 1;
        iVar10 = 0;
        this_00 = (synchronization_internal *)0x0;
        iVar8 = extraout_EDX_04;
      }
      else {
        if (((-(ulong)((flags & 1U) == 0) | 0xffffffffffffffdf) & pMVar2->slow_inc_need_zero & uVar9
            ) != 0) {
          uVar6 = uVar9;
          if ((uVar9 & 0x40) == 0) {
            LOCK();
            uVar6 = (this->mu_).super___atomic_base<long>._M_i;
            bVar11 = uVar9 == uVar6;
            if (bVar11) {
              (this->mu_).super___atomic_base<long>._M_i =
                   ((ulong)((uint)((flags & 1U) == 0) * 2) | 0xffffffffffffffb9) & uVar9 | 0x44;
              uVar6 = uVar9;
            }
            UNLOCK();
            if (bVar11) {
              pPVar5 = Enqueue((PerThreadSynch *)(uVar6 & 0xffffffffffffff00),waitp,uVar6,flags);
              iVar8 = extraout_EDX_00;
              if (pPVar5 == (PerThreadSynch *)0x0) {
                LockSlowLoop();
                iVar8 = extraout_EDX_06;
              }
              uVar9 = (ulong)(((uint)uVar6 & 1) << 5);
              if (waitp->how != (MuHow)kExclusiveS) {
                uVar9 = 0;
              }
              do {
                uVar7 = (this->mu_).super___atomic_base<long>._M_i;
                LOCK();
                uVar6 = (this->mu_).super___atomic_base<long>._M_i;
                bVar11 = uVar7 == uVar6;
                if (bVar11) {
                  (this->mu_).super___atomic_base<long>._M_i =
                       (ulong)((uint)uVar7 & 0xbb) | uVar9 | (ulong)pPVar5 | 4;
                  uVar6 = uVar7;
                }
                UNLOCK();
              } while (!bVar11);
              bVar11 = true;
              goto LAB_00144c77;
            }
          }
LAB_00144c75:
          bVar11 = false;
          goto LAB_00144c77;
        }
        LOCK();
        uVar6 = (this->mu_).super___atomic_base<long>._M_i;
        bVar11 = uVar9 == uVar6;
        if (bVar11) {
          (this->mu_).super___atomic_base<long>._M_i =
               ((ulong)((uint)((flags & 1U) == 0) * 2) | 0xffffffffffffffbc) & uVar9 | 0x41;
          uVar6 = uVar9;
        }
        UNLOCK();
        if (!bVar11) goto LAB_00144c75;
        plVar1 = (long *)((uVar6 & 0xffffffffffffff00) + 0x28);
        *plVar1 = *plVar1 + 0x100;
        do {
          uVar9 = (this->mu_).super___atomic_base<long>._M_i;
          LOCK();
          uVar6 = (this->mu_).super___atomic_base<long>._M_i;
          bVar11 = uVar9 == uVar6;
          if (bVar11) {
            (this->mu_).super___atomic_base<long>._M_i = (uVar9 & 0xffffffffffffffbe) + 1;
            uVar6 = uVar9;
          }
          UNLOCK();
        } while (!bVar11);
        pCVar3 = waitp->cond;
        iVar10 = 6;
        if ((pCVar3 == (Condition *)0x0) || (pCVar3->eval_ == (_func_bool_Condition_ptr *)0x0)) {
          bVar11 = false;
        }
        else {
          bVar4 = (*pCVar3->eval_)(pCVar3);
          bVar11 = false;
          iVar8 = extraout_EDX_02;
          if (!bVar4) {
            UnlockSlow(this,waitp);
            Block(this,waitp->thread);
            flags = flags | 1;
            bVar11 = true;
            iVar10 = 0;
            local_38 = 0;
            iVar8 = extraout_EDX_03;
          }
        }
        if (bVar11) goto LAB_00144c75;
LAB_00144c95:
        this_00 = (synchronization_internal *)(ulong)local_38;
      }
      if (iVar10 != 0) goto LAB_00144ce1;
    }
    if ((waitp->thread->waitp != (SynchWaitParams *)0x0) &&
       (waitp->thread->suppress_fatal_errors == false)) {
      LockSlowLoop();
      iVar8 = extraout_EDX_05;
    }
    local_38 = synchronization_internal::MutexDelay(this_00,1,iVar8);
  } while( true );
}

Assistant:

void Mutex::LockSlowLoop(SynchWaitParams *waitp, int flags) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  int c = 0;
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(this,
         waitp->how == kExclusive?  SYNCH_EV_LOCK: SYNCH_EV_READERLOCK);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  for (;;) {
    v = mu_.load(std::memory_order_relaxed);
    CheckForMutexCorruption(v, "Lock");
    if ((v & waitp->how->slow_need_zero) == 0) {
      if (mu_.compare_exchange_strong(
              v,
              (waitp->how->fast_or |
               (v & ClearDesignatedWakerMask(flags & kMuHasBlocked))) +
                  waitp->how->fast_add,
              std::memory_order_acquire, std::memory_order_relaxed)) {
        if (waitp->cond == nullptr ||
            EvalConditionAnnotated(waitp->cond, this, true, false,
                                   waitp->how == kShared)) {
          break;  // we timed out, or condition true, so return
        }
        this->UnlockSlow(waitp);  // got lock but condition false
        this->Block(waitp->thread);
        flags |= kMuHasBlocked;
        c = 0;
      }
    } else {                      // need to access waiter list
      bool dowait = false;
      if ((v & (kMuSpin|kMuWait)) == 0) {   // no waiters
        // This thread tries to become the one and only waiter.
        PerThreadSynch *new_h = Enqueue(nullptr, waitp, v, flags);
        intptr_t nv =
            (v & ClearDesignatedWakerMask(flags & kMuHasBlocked) & kMuLow) |
            kMuWait;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to empty list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          nv |= kMuWrWait;
        }
        if (mu_.compare_exchange_strong(
                v, reinterpret_cast<intptr_t>(new_h) | nv,
                std::memory_order_release, std::memory_order_relaxed)) {
          dowait = true;
        } else {            // attempted Enqueue() failed
          // zero out the waitp field set by Enqueue()
          waitp->thread->waitp = nullptr;
        }
      } else if ((v & waitp->how->slow_inc_need_zero &
                  IgnoreWaitingWritersMask(flags & kMuHasBlocked)) == 0) {
        // This is a reader that needs to increment the reader count,
        // but the count is currently held in the last waiter.
        if (mu_.compare_exchange_strong(
                v,
                (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                    kMuSpin | kMuReader,
                std::memory_order_acquire, std::memory_order_relaxed)) {
          PerThreadSynch *h = GetPerThreadSynch(v);
          h->readers += kMuOne;       // inc reader count in waiter
          do {                        // release spinlock
            v = mu_.load(std::memory_order_relaxed);
          } while (!mu_.compare_exchange_weak(v, (v & ~kMuSpin) | kMuReader,
                                              std::memory_order_release,
                                              std::memory_order_relaxed));
          if (waitp->cond == nullptr ||
              EvalConditionAnnotated(waitp->cond, this, true, false,
                                     waitp->how == kShared)) {
            break;  // we timed out, or condition true, so return
          }
          this->UnlockSlow(waitp);           // got lock but condition false
          this->Block(waitp->thread);
          flags |= kMuHasBlocked;
          c = 0;
        }
      } else if ((v & kMuSpin) == 0 &&  // attempt to queue ourselves
                 mu_.compare_exchange_strong(
                     v,
                     (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                         kMuSpin | kMuWait,
                     std::memory_order_acquire, std::memory_order_relaxed)) {
        PerThreadSynch *h = GetPerThreadSynch(v);
        PerThreadSynch *new_h = Enqueue(h, waitp, v, flags);
        intptr_t wr_wait = 0;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          wr_wait = kMuWrWait;      // give priority to a waiting writer
        }
        do {                        // release spinlock
          v = mu_.load(std::memory_order_relaxed);
        } while (!mu_.compare_exchange_weak(
            v, (v & (kMuLow & ~kMuSpin)) | kMuWait | wr_wait |
            reinterpret_cast<intptr_t>(new_h),
            std::memory_order_release, std::memory_order_relaxed));
        dowait = true;
      }
      if (dowait) {
        this->Block(waitp->thread);  // wait until removed from list or timeout
        flags |= kMuHasBlocked;
        c = 0;
      }
    }
    ABSL_RAW_CHECK(
        waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
        "detected illegal recursion into Mutex code");
    // delay, then try again
    c = synchronization_internal::MutexDelay(c, GENTLE);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(this,
                   waitp->how == kExclusive? SYNCH_EV_LOCK_RETURNING :
                                      SYNCH_EV_READERLOCK_RETURNING);
  }
}